

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::pair_range_esc
          (basic_substring<const_char> *this,CC open_close,CC escape)

{
  ulong uVar1;
  code *pcVar2;
  size_t sVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  basic_substring<const_char> bVar9;
  basic_substring<const_char> local_40;
  
  sVar7 = 0;
  sVar5 = first_of(this,open_close,0);
  if (sVar5 == 0xffffffffffffffff) {
    pcVar6 = (char *)0x0;
  }
  else {
    uVar1 = this->len;
    pcVar6 = (char *)0x0;
    sVar7 = sVar5;
    do {
      sVar3 = sVar7;
      sVar7 = sVar3 + 1;
      if (uVar1 <= sVar7) {
        sVar7 = 0;
        goto LAB_001ecb8a;
      }
    } while ((this->str[sVar7] != open_close) || (this->str[sVar3] == escape));
    if (uVar1 < sVar5) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar2 = (code *)swi(3);
        bVar9 = (basic_substring<const_char>)(*pcVar2)();
        return bVar9;
      }
      handle_error(0x20a4ad,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1544,"first >= 0 && first <= len");
    }
    uVar8 = sVar3 + 2;
    if (sVar7 == 0xfffffffffffffffe) {
      uVar8 = uVar1;
    }
    if (uVar8 < sVar5) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar2 = (code *)swi(3);
        bVar9 = (basic_substring<const_char>)(*pcVar2)();
        return bVar9;
      }
      handle_error(0x20a4ad,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1546,"first <= last");
    }
    if (uVar1 < uVar8) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar2 = (code *)swi(3);
        bVar9 = (basic_substring<const_char>)(*pcVar2)();
        return bVar9;
      }
      handle_error(0x20a4ad,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1547,"last >= 0 && last <= len");
    }
    basic_substring(&local_40,this->str + sVar5,uVar8 - sVar5);
    pcVar6 = local_40.str;
    sVar7 = local_40.len;
  }
LAB_001ecb8a:
  bVar9.len = sVar7;
  bVar9.str = pcVar6;
  return bVar9;
}

Assistant:

basic_substring pair_range_esc(CC open_close, CC escape=CC('\\'))
    {
        size_t b = find(open_close);
        if(b == npos) return basic_substring();
        for(size_t i = b+1; i < len; ++i)
        {
            CC c = str[i];
            if(c == open_close)
            {
                if(str[i-1] != escape)
                {
                    return range(b, i+1);
                }
            }
        }
        return basic_substring();
    }